

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O0

void nsvg__bevelJoin(NSVGrasterizer *r,NSVGpoint *left,NSVGpoint *right,NSVGpoint *p0,NSVGpoint *p1,
                    float lineWidth)

{
  float fVar1;
  float x0;
  float y0;
  float x1;
  float y1;
  float x0_00;
  float y0_00;
  float x1_00;
  float ry1;
  float rx1;
  float ly1;
  float lx1;
  float ry0;
  float rx0;
  float ly0;
  float lx0;
  float dly1;
  float dlx1;
  float dly0;
  float dlx0;
  float w;
  float lineWidth_local;
  NSVGpoint *p1_local;
  NSVGpoint *p0_local;
  NSVGpoint *right_local;
  NSVGpoint *left_local;
  NSVGrasterizer *r_local;
  
  fVar1 = lineWidth * 0.5;
  x0 = -p0->dy * fVar1 + p1->x;
  y0 = --p0->dx * fVar1 + p1->y;
  x1 = p0->dy * fVar1 + p1->x;
  y1 = -p0->dx * fVar1 + p1->y;
  x0_00 = -p1->dy * fVar1 + p1->x;
  y0_00 = --p1->dx * fVar1 + p1->y;
  x1_00 = p1->dy * fVar1 + p1->x;
  fVar1 = -p1->dx * fVar1 + p1->y;
  nsvg__addEdge(r,x0,y0,left->x,left->y);
  nsvg__addEdge(r,x0_00,y0_00,x0,y0);
  nsvg__addEdge(r,right->x,right->y,x1,y1);
  nsvg__addEdge(r,x1,y1,x1_00,fVar1);
  left->x = x0_00;
  left->y = y0_00;
  right->x = x1_00;
  right->y = fVar1;
  return;
}

Assistant:

static void nsvg__bevelJoin(NSVGrasterizer* r, NSVGpoint* left, NSVGpoint* right, NSVGpoint* p0, NSVGpoint* p1, float lineWidth)
{
	float w = lineWidth * 0.5f;
	float dlx0 = p0->dy, dly0 = -p0->dx;
	float dlx1 = p1->dy, dly1 = -p1->dx;
	float lx0 = p1->x - (dlx0 * w), ly0 = p1->y - (dly0 * w);
	float rx0 = p1->x + (dlx0 * w), ry0 = p1->y + (dly0 * w);
	float lx1 = p1->x - (dlx1 * w), ly1 = p1->y - (dly1 * w);
	float rx1 = p1->x + (dlx1 * w), ry1 = p1->y + (dly1 * w);

	nsvg__addEdge(r, lx0, ly0, left->x, left->y);
	nsvg__addEdge(r, lx1, ly1, lx0, ly0);

	nsvg__addEdge(r, right->x, right->y, rx0, ry0);
	nsvg__addEdge(r, rx0, ry0, rx1, ry1);

	left->x = lx1; left->y = ly1;
	right->x = rx1; right->y = ry1;
}